

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLStream.cpp
# Opt level: O2

void __thiscall
ODDLParser::IOStreamBase::IOStreamBase(IOStreamBase *this,StreamFormatterBase *formatter)

{
  StreamFormatterBase *pSVar1;
  
  this->_vptr_IOStreamBase = (_func_int **)&PTR__IOStreamBase_0082d178;
  this->m_formatter = formatter;
  this->m_file = (FILE *)0x0;
  if (formatter != (StreamFormatterBase *)0x0) {
    return;
  }
  pSVar1 = (StreamFormatterBase *)operator_new(8);
  pSVar1->_vptr_StreamFormatterBase = (_func_int **)&PTR__StreamFormatterBase_0082d150;
  this->m_formatter = pSVar1;
  return;
}

Assistant:

IOStreamBase::IOStreamBase(StreamFormatterBase *formatter)
    : m_formatter(formatter)
    , m_file(ddl_nullptr) {
    if (ddl_nullptr == m_formatter) {
        m_formatter = new StreamFormatterBase;
    }
}